

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allphone_search.c
# Opt level: O1

void allphone_search_free(ps_search_t *search)

{
  int iVar1;
  bin_mdef_t *pbVar2;
  hmm_t *phVar3;
  void *pvVar4;
  hmm_t *hmm;
  void *ptr;
  long lVar5;
  short sVar6;
  double dVar7;
  
  iVar1 = *(int *)&search[1].hyp_str;
  lVar5 = ps_config_int(search->config,"frate");
  dVar7 = (double)iVar1 / (double)lVar5;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
          ,0x289,"TOTAL allphone %.2f CPU %.3f xRT\n",search[2].type,(double)search[2].type / dVar7)
  ;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
          ,0x28c,"TOTAL allphone %.2f wall %.3f xRT\n",search[2].name,(double)search[2].name / dVar7
         );
  ps_search_base_free(search);
  allphone_clear_segments((allphone_search_t *)search);
  hmm_context_free((hmm_context_t *)search[1].vt);
  if (search[1].pls != (ps_search_t *)0x0) {
    ckd_free((search[1].pls)->vt[1].reinit);
    pbVar2 = search->acmod->mdef;
    if (0 < pbVar2->n_ciphone) {
      sVar6 = 0;
      do {
        hmm = (hmm_t *)(&(search[1].pls)->vt)[sVar6];
        while (hmm != (hmm_t *)0x0) {
          phVar3 = *(hmm_t **)(hmm[1].score + 4);
          ptr = *(void **)(hmm[1].history + 1);
          while (ptr != (void *)0x0) {
            pvVar4 = *(void **)((long)ptr + 8);
            ckd_free(ptr);
            ptr = pvVar4;
          }
          hmm_deinit(hmm);
          ckd_free(hmm);
          hmm = phVar3;
        }
        sVar6 = sVar6 + 1;
      } while ((int)sVar6 < pbVar2->n_ciphone);
    }
    ckd_free(search[1].pls);
  }
  if ((ngram_model_t *)search[1].type != (ngram_model_t *)0x0) {
    ngram_model_free((ngram_model_t *)search[1].type);
  }
  if (search[1].config != (cmd_ln_t *)0x0) {
    ckd_free(search[1].config);
  }
  if (search[1].last_link != (ps_latlink_t *)0x0) {
    blkarray_list_free((blkarray_list_t *)search[1].last_link);
  }
  ckd_free(search);
  return;
}

Assistant:

void
allphone_search_free(ps_search_t * search)
{
    allphone_search_t *allphs = (allphone_search_t *) search;

    
    double n_speech = (double)allphs->n_tot_frame
            / ps_config_int(ps_search_config(allphs), "frate");

    E_INFO("TOTAL allphone %.2f CPU %.3f xRT\n",
           allphs->perf.t_tot_cpu,
           allphs->perf.t_tot_cpu / n_speech);
    E_INFO("TOTAL allphone %.2f wall %.3f xRT\n",
           allphs->perf.t_tot_elapsed,
           allphs->perf.t_tot_elapsed / n_speech);

    ps_search_base_free(search);

    allphone_clear_segments(allphs);
    hmm_context_free(allphs->hmmctx);
    phmm_free(allphs);
    if (allphs->lm)
        ngram_model_free(allphs->lm);
    if (allphs->ci2lmwid)
        ckd_free(allphs->ci2lmwid);
    if (allphs->history)
        blkarray_list_free(allphs->history);

    ckd_free(allphs);
}